

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
efsw::FileWatcherGeneric::directories_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FileWatcherGeneric *this)

{
  bool bVar1;
  reference ppWVar2;
  _Self local_40;
  _Self local_38;
  iterator it;
  FileWatcherGeneric *this_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  Mutex::lock(&this->mWatchesLock);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::begin
                 (&this->mWatches);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::end
                   (&this->mWatches);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppWVar2 = std::_List_iterator<efsw::WatcherGeneric_*>::operator*(&local_38);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&((*ppWVar2)->super_Watcher).Directory);
    std::_List_iterator<efsw::WatcherGeneric_*>::operator++(&local_38,0);
  }
  Mutex::unlock(&this->mWatchesLock);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string> FileWatcherGeneric::directories()
{
	std::list<std::string> dirs;

	mWatchesLock.lock();

	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); it++ )
	{
		dirs.push_back( (*it)->Directory );
	}

	mWatchesLock.unlock();

	return dirs;
}